

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsFindClosingParenthesis(char *pStr,char Open,char Close)

{
  bool bVar1;
  int local_20;
  int fNotName;
  int Counter;
  char Close_local;
  char Open_local;
  char *pStr_local;
  
  local_20 = 0;
  bVar1 = true;
  _Counter = pStr;
  if (*pStr != Open) {
    __assert_fail("*pStr == Open",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                  ,0xd2,"char *Wlc_PrsFindClosingParenthesis(char *, char, char)");
  }
  do {
    if (*_Counter == '\0') {
      return (char *)0x0;
    }
    if (bVar1) {
      if (*_Counter == Open) {
        local_20 = local_20 + 1;
      }
      if (*_Counter == Close) {
        local_20 = local_20 + -1;
      }
      if (local_20 == 0) {
        return _Counter;
      }
    }
    if (*_Counter == '\\') {
      bVar1 = false;
    }
    else if ((!bVar1) && (*_Counter == ' ')) {
      bVar1 = true;
    }
    _Counter = _Counter + 1;
  } while( true );
}

Assistant:

static inline char * Wlc_PrsFindClosingParenthesis( char * pStr, char Open, char Close )
{
    int Counter = 0;
    int fNotName = 1;
    assert( *pStr == Open );
    for ( ; *pStr; pStr++ )
    {
        if ( fNotName )
        {
            if ( *pStr == Open )
                Counter++;
            if ( *pStr == Close )
                Counter--;
            if ( Counter == 0 )
                return pStr;
        }
        if ( *pStr == '\\' )
            fNotName = 0;
        else if ( !fNotName && *pStr == ' ' )
            fNotName = 1;
    }
    return NULL;
}